

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retinaface.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ulong uVar3;
  undefined4 uVar6;
  ulong uVar4;
  undefined4 uVar7;
  undefined8 uVar5;
  char *pcVar8;
  int iVar9;
  int *piVar10;
  undefined1 auVar11 [16];
  char cVar12;
  int iVar13;
  int iVar14;
  pointer pFVar15;
  ulong uVar16;
  float *pfVar17;
  Mat *pMVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  float fVar22;
  float fVar23;
  float fVar26;
  __m128 t_2;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  __m128 t;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  Extractor ex;
  allocator local_459;
  vector<float,_std::allocator<float>_> areas;
  vector<FaceObject,_std::allocator<FaceObject>_> faceobjects32;
  int baseLine;
  undefined1 local_3e8 [64];
  size_t local_3a8;
  undefined1 local_398 [64];
  size_t local_358;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  vector<FaceObject,_std::allocator<FaceObject>_> faceproposals;
  Size label_size;
  undefined1 local_318 [32];
  Allocator *local_2f8;
  int iStack_2f0;
  int iStack_2ec;
  undefined1 auStack_2e8 [12];
  size_t local_2d8;
  undefined1 local_2c8 [32];
  Allocator *local_2a8;
  int iStack_2a0;
  int iStack_29c;
  undefined1 auStack_298 [12];
  size_t local_288;
  vector<FaceObject,_std::allocator<FaceObject>_> faceobjects;
  Mat local_258;
  int local_210;
  int local_20c;
  int local_208;
  int local_204;
  ulong local_200;
  Mat image;
  undefined4 local_1f0;
  int iStack_1ec;
  Allocator *local_1d8;
  Net retinaface;
  Mat m;
  undefined8 local_88;
  uchar *local_80;
  
  if (argc == 2) {
    pcVar8 = argv[1];
    std::__cxx11::string::string((string *)&retinaface,pcVar8,(allocator *)&image);
    cv::imread((string *)&m,(int)&retinaface);
    std::__cxx11::string::~string((string *)&retinaface);
    cVar12 = cv::Mat::empty();
    if (cVar12 == '\0') {
      faceobjects.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      faceobjects.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      faceobjects.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ncnn::Net::Net(&retinaface);
      retinaface.opt.use_vulkan_compute = true;
      iVar13 = ncnn::Net::load_param(&retinaface,"mnet.25-opt.param");
      if ((iVar13 != 0) ||
         (iVar13 = ncnn::Net::load_model(&retinaface,"mnet.25-opt.bin"), iVar13 != 0)) {
        exit(-1);
      }
      local_348 = (float)local_88;
      fStack_344 = (float)((ulong)local_88 >> 0x20);
      fStack_340 = 0.0;
      fStack_33c = 0.0;
      ncnn::Mat::from_pixels
                ((Mat *)&image,local_80,0x10002,(int)fStack_344,(int)local_348,(Allocator *)0x0);
      ncnn::Net::create_extractor((Net *)&ex);
      ncnn::Extractor::input(&ex,"data",(Mat *)&image);
      faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start._0_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start._4_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._4_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_358 = 0;
      local_398._0_8_ = (pointer)0x0;
      local_398._8_4_ = 0;
      local_398._12_4_ = 0;
      local_398._16_8_ = (pointer)0x0;
      local_398._24_4_ = 0;
      local_398._32_8_ = (Allocator *)0x0;
      local_398._40_4_ = 0;
      local_398._44_4_ = 0;
      local_398._48_12_ = SUB1612((undefined1  [16])0x0,4);
      local_3a8 = 0;
      local_3e8._0_4_ = 0;
      local_3e8._4_4_ = 0;
      local_3e8._8_4_ = 0;
      local_3e8._12_4_ = 0;
      local_3e8._16_8_ = 0;
      local_3e8._24_4_ = 0;
      local_3e8._32_8_ = (Allocator *)0x0;
      local_3e8._40_4_ = 0;
      local_3e8._44_4_ = 0;
      local_3e8._48_12_ = SUB1612((undefined1  [16])0x0,4);
      ncnn::Extractor::extract(&ex,"face_rpn_cls_prob_reshape_stride32",(Mat *)&areas,0);
      ncnn::Extractor::extract(&ex,"face_rpn_bbox_pred_stride32",(Mat *)local_398,0);
      ncnn::Extractor::extract(&ex,"face_rpn_landmark_pred_stride32",(Mat *)local_3e8,0);
      local_2d8 = 0;
      local_318._0_4_ = 0;
      local_318._4_4_ = 0;
      local_318._8_4_ = 0;
      local_318._12_4_ = 0;
      local_318._16_12_ = SUB1612((undefined1  [16])0x0,4);
      local_2f8 = (Allocator *)0x0;
      iStack_2f0 = 0;
      iStack_2ec = 0;
      auStack_2e8 = SUB1612((undefined1  [16])0x0,4);
      ncnn::Mat::create((Mat *)local_318,1,4,(Allocator *)0x0);
      *(undefined4 *)CONCAT44(local_318._4_4_,local_318._0_4_) = 0x3f800000;
      local_288 = 0;
      local_2c8._0_4_ = 0;
      local_2c8._4_4_ = 0;
      local_2c8._8_4_ = 0;
      local_2c8._12_4_ = 0;
      local_2c8._16_12_ = SUB1612((undefined1  [16])0x0,4);
      local_2a8 = (Allocator *)0x0;
      iStack_2a0 = 0;
      iStack_29c = 0;
      auStack_298 = SUB1612((undefined1  [16])0x0,4);
      pMVar18 = (Mat *)0x0;
      ncnn::Mat::create((Mat *)local_2c8,2,4,(Allocator *)0x0);
      *(undefined8 *)CONCAT44(local_2c8._4_4_,local_2c8._0_4_) = 0x4180000042000000;
      generate_anchors(&local_258,(int)local_318,(Mat *)local_2c8,pMVar18);
      faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      generate_proposals(&local_258,0x20,(Mat *)&areas,(Mat *)local_398,(Mat *)local_3e8,0.0,
                         &faceobjects32);
      std::vector<FaceObject,std::allocator<FaceObject>>::
      insert<__gnu_cxx::__normal_iterator<FaceObject*,std::vector<FaceObject,std::allocator<FaceObject>>>,void>
                ((vector<FaceObject,std::allocator<FaceObject>> *)&faceproposals,
                 (const_iterator)
                 faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (__normal_iterator<FaceObject_*,_std::vector<FaceObject,_std::allocator<FaceObject>_>_>
                  )faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl
                   .super__Vector_impl_data._M_start,
                 (__normal_iterator<FaceObject_*,_std::vector<FaceObject,_std::allocator<FaceObject>_>_>
                  )faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl
                   .super__Vector_impl_data._M_finish);
      std::_Vector_base<FaceObject,_std::allocator<FaceObject>_>::~_Vector_base
                (&faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>);
      if (local_258.refcount != (int *)0x0) {
        LOCK();
        *local_258.refcount = *local_258.refcount + -1;
        UNLOCK();
        if (*local_258.refcount == 0) {
          if (local_258.allocator == (Allocator *)0x0) {
            free((void *)CONCAT44(local_258.data._4_4_,(int)local_258.data));
          }
          else {
            (*(local_258.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar10 = (int *)CONCAT44(local_2c8._12_4_,local_2c8._8_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if (local_2a8 == (Allocator *)0x0) {
            free((void *)CONCAT44(local_2c8._4_4_,local_2c8._0_4_));
          }
          else {
            (*local_2a8->_vptr_Allocator[3])();
          }
        }
      }
      piVar10 = (int *)CONCAT44(local_318._12_4_,local_318._8_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if (local_2f8 == (Allocator *)0x0) {
            free((void *)CONCAT44(local_318._4_4_,local_318._0_4_));
          }
          else {
            (*local_2f8->_vptr_Allocator[3])();
          }
        }
      }
      piVar10 = (int *)CONCAT44(local_3e8._12_4_,local_3e8._8_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if ((Allocator *)local_3e8._32_8_ == (Allocator *)0x0) {
            free((void *)CONCAT44(local_3e8._4_4_,local_3e8._0_4_));
          }
          else {
            (*(*(_func_int ***)local_3e8._32_8_)[3])();
          }
        }
      }
      piVar10 = (int *)CONCAT44(local_398._12_4_,local_398._8_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if ((Allocator *)local_398._32_8_ == (Allocator *)0x0) {
            free((void *)local_398._0_8_);
          }
          else {
            (*(*(_func_int ***)local_398._32_8_)[3])();
          }
        }
      }
      piVar10 = (int *)CONCAT44(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._4_4_,
                                areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._0_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          free((void *)CONCAT44(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_,
                                areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start._0_4_));
        }
      }
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start._0_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start._4_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._4_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_358 = 0;
      local_398._0_8_ = (pointer)0x0;
      local_398._8_4_ = 0;
      local_398._12_4_ = 0;
      local_398._16_8_ = (pointer)0x0;
      local_398._24_4_ = 0;
      local_398._32_8_ = (Allocator *)0x0;
      local_398._40_4_ = 0;
      local_398._44_4_ = 0;
      local_398._48_12_ = SUB1612((undefined1  [16])0x0,4);
      local_3a8 = 0;
      local_3e8._0_4_ = 0;
      local_3e8._4_4_ = 0;
      local_3e8._8_4_ = 0;
      local_3e8._12_4_ = 0;
      local_3e8._16_8_ = 0;
      local_3e8._24_4_ = 0;
      local_3e8._32_8_ = (Allocator *)0x0;
      local_3e8._40_4_ = 0;
      local_3e8._44_4_ = 0;
      local_3e8._48_12_ = SUB1612((undefined1  [16])0x0,4);
      ncnn::Extractor::extract(&ex,"face_rpn_cls_prob_reshape_stride16",(Mat *)&areas,0);
      ncnn::Extractor::extract(&ex,"face_rpn_bbox_pred_stride16",(Mat *)local_398,0);
      ncnn::Extractor::extract(&ex,"face_rpn_landmark_pred_stride16",(Mat *)local_3e8,0);
      local_2d8 = 0;
      local_318._0_4_ = 0;
      local_318._4_4_ = 0;
      local_318._8_4_ = 0;
      local_318._12_4_ = 0;
      local_318._16_12_ = SUB1612((undefined1  [16])0x0,4);
      local_2f8 = (Allocator *)0x0;
      iStack_2f0 = 0;
      iStack_2ec = 0;
      auStack_2e8 = SUB1612((undefined1  [16])0x0,4);
      ncnn::Mat::create((Mat *)local_318,1,4,(Allocator *)0x0);
      *(undefined4 *)CONCAT44(local_318._4_4_,local_318._0_4_) = 0x3f800000;
      local_288 = 0;
      local_2c8._0_4_ = 0;
      local_2c8._4_4_ = 0;
      local_2c8._8_4_ = 0;
      local_2c8._12_4_ = 0;
      local_2c8._16_12_ = SUB1612((undefined1  [16])0x0,4);
      local_2a8 = (Allocator *)0x0;
      iStack_2a0 = 0;
      iStack_29c = 0;
      auStack_298 = SUB1612((undefined1  [16])0x0,4);
      pMVar18 = (Mat *)0x0;
      ncnn::Mat::create((Mat *)local_2c8,2,4,(Allocator *)0x0);
      *(undefined8 *)CONCAT44(local_2c8._4_4_,local_2c8._0_4_) = 0x4080000041000000;
      generate_anchors(&local_258,(int)local_318,(Mat *)local_2c8,pMVar18);
      faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      generate_proposals(&local_258,0x10,(Mat *)&areas,(Mat *)local_398,(Mat *)local_3e8,0.0,
                         &faceobjects32);
      std::vector<FaceObject,std::allocator<FaceObject>>::
      insert<__gnu_cxx::__normal_iterator<FaceObject*,std::vector<FaceObject,std::allocator<FaceObject>>>,void>
                ((vector<FaceObject,std::allocator<FaceObject>> *)&faceproposals,
                 (const_iterator)
                 faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (__normal_iterator<FaceObject_*,_std::vector<FaceObject,_std::allocator<FaceObject>_>_>
                  )faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl
                   .super__Vector_impl_data._M_start,
                 (__normal_iterator<FaceObject_*,_std::vector<FaceObject,_std::allocator<FaceObject>_>_>
                  )faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl
                   .super__Vector_impl_data._M_finish);
      std::_Vector_base<FaceObject,_std::allocator<FaceObject>_>::~_Vector_base
                (&faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>);
      if (local_258.refcount != (int *)0x0) {
        LOCK();
        *local_258.refcount = *local_258.refcount + -1;
        UNLOCK();
        if (*local_258.refcount == 0) {
          if (local_258.allocator == (Allocator *)0x0) {
            free((void *)CONCAT44(local_258.data._4_4_,(int)local_258.data));
          }
          else {
            (*(local_258.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar10 = (int *)CONCAT44(local_2c8._12_4_,local_2c8._8_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if (local_2a8 == (Allocator *)0x0) {
            free((void *)CONCAT44(local_2c8._4_4_,local_2c8._0_4_));
          }
          else {
            (*local_2a8->_vptr_Allocator[3])();
          }
        }
      }
      piVar10 = (int *)CONCAT44(local_318._12_4_,local_318._8_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if (local_2f8 == (Allocator *)0x0) {
            free((void *)CONCAT44(local_318._4_4_,local_318._0_4_));
          }
          else {
            (*local_2f8->_vptr_Allocator[3])();
          }
        }
      }
      piVar10 = (int *)CONCAT44(local_3e8._12_4_,local_3e8._8_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if ((Allocator *)local_3e8._32_8_ == (Allocator *)0x0) {
            free((void *)CONCAT44(local_3e8._4_4_,local_3e8._0_4_));
          }
          else {
            (*(*(_func_int ***)local_3e8._32_8_)[3])();
          }
        }
      }
      piVar10 = (int *)CONCAT44(local_398._12_4_,local_398._8_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if ((Allocator *)local_398._32_8_ == (Allocator *)0x0) {
            free((void *)local_398._0_8_);
          }
          else {
            (*(*(_func_int ***)local_398._32_8_)[3])();
          }
        }
      }
      piVar10 = (int *)CONCAT44(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._4_4_,
                                areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._0_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          free((void *)CONCAT44(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_,
                                areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start._0_4_));
        }
      }
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start._0_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start._4_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._4_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_358 = 0;
      local_398._0_8_ = (pointer)0x0;
      local_398._8_4_ = 0;
      local_398._12_4_ = 0;
      local_398._16_8_ = (pointer)0x0;
      local_398._24_4_ = 0;
      local_398._32_8_ = (Allocator *)0x0;
      local_398._40_4_ = 0;
      local_398._44_4_ = 0;
      local_398._48_12_ = SUB1612((undefined1  [16])0x0,4);
      local_3a8 = 0;
      local_3e8._0_4_ = 0;
      local_3e8._4_4_ = 0;
      local_3e8._8_4_ = 0;
      local_3e8._12_4_ = 0;
      local_3e8._16_8_ = 0;
      local_3e8._24_4_ = 0;
      local_3e8._32_8_ = (Allocator *)0x0;
      local_3e8._40_4_ = 0;
      local_3e8._44_4_ = 0;
      local_3e8._48_12_ = SUB1612((undefined1  [16])0x0,4);
      ncnn::Extractor::extract(&ex,"face_rpn_cls_prob_reshape_stride8",(Mat *)&areas,0);
      ncnn::Extractor::extract(&ex,"face_rpn_bbox_pred_stride8",(Mat *)local_398,0);
      ncnn::Extractor::extract(&ex,"face_rpn_landmark_pred_stride8",(Mat *)local_3e8,0);
      local_2d8 = 0;
      local_318._0_4_ = 0;
      local_318._4_4_ = 0;
      local_318._8_4_ = 0;
      local_318._12_4_ = 0;
      local_318._16_12_ = SUB1612((undefined1  [16])0x0,4);
      local_2f8 = (Allocator *)0x0;
      iStack_2f0 = 0;
      iStack_2ec = 0;
      auStack_2e8 = SUB1612((undefined1  [16])0x0,4);
      ncnn::Mat::create((Mat *)local_318,1,4,(Allocator *)0x0);
      *(undefined4 *)CONCAT44(local_318._4_4_,local_318._0_4_) = 0x3f800000;
      local_288 = 0;
      local_2c8._0_4_ = 0;
      local_2c8._4_4_ = 0;
      local_2c8._8_4_ = 0;
      local_2c8._12_4_ = 0;
      local_2c8._16_12_ = SUB1612((undefined1  [16])0x0,4);
      local_2a8 = (Allocator *)0x0;
      iStack_2a0 = 0;
      iStack_29c = 0;
      auStack_298 = SUB1612((undefined1  [16])0x0,4);
      pMVar18 = (Mat *)0x0;
      ncnn::Mat::create((Mat *)local_2c8,2,4,(Allocator *)0x0);
      *(undefined8 *)CONCAT44(local_2c8._4_4_,local_2c8._0_4_) = 0x3f80000040000000;
      generate_anchors(&local_258,(int)local_318,(Mat *)local_2c8,pMVar18);
      faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      generate_proposals(&local_258,8,(Mat *)&areas,(Mat *)local_398,(Mat *)local_3e8,0.0,
                         &faceobjects32);
      std::vector<FaceObject,std::allocator<FaceObject>>::
      insert<__gnu_cxx::__normal_iterator<FaceObject*,std::vector<FaceObject,std::allocator<FaceObject>>>,void>
                ((vector<FaceObject,std::allocator<FaceObject>> *)&faceproposals,
                 (const_iterator)
                 faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (__normal_iterator<FaceObject_*,_std::vector<FaceObject,_std::allocator<FaceObject>_>_>
                  )faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl
                   .super__Vector_impl_data._M_start,
                 (__normal_iterator<FaceObject_*,_std::vector<FaceObject,_std::allocator<FaceObject>_>_>
                  )faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl
                   .super__Vector_impl_data._M_finish);
      std::_Vector_base<FaceObject,_std::allocator<FaceObject>_>::~_Vector_base
                (&faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>);
      if (local_258.refcount != (int *)0x0) {
        LOCK();
        *local_258.refcount = *local_258.refcount + -1;
        UNLOCK();
        if (*local_258.refcount == 0) {
          if (local_258.allocator == (Allocator *)0x0) {
            free((void *)CONCAT44(local_258.data._4_4_,(int)local_258.data));
          }
          else {
            (*(local_258.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar10 = (int *)CONCAT44(local_2c8._12_4_,local_2c8._8_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if (local_2a8 == (Allocator *)0x0) {
            free((void *)CONCAT44(local_2c8._4_4_,local_2c8._0_4_));
          }
          else {
            (*local_2a8->_vptr_Allocator[3])();
          }
        }
      }
      piVar10 = (int *)CONCAT44(local_318._12_4_,local_318._8_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if (local_2f8 == (Allocator *)0x0) {
            free((void *)CONCAT44(local_318._4_4_,local_318._0_4_));
          }
          else {
            (*local_2f8->_vptr_Allocator[3])();
          }
        }
      }
      piVar10 = (int *)CONCAT44(local_3e8._12_4_,local_3e8._8_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if ((Allocator *)local_3e8._32_8_ == (Allocator *)0x0) {
            free((void *)CONCAT44(local_3e8._4_4_,local_3e8._0_4_));
          }
          else {
            (*(*(_func_int ***)local_3e8._32_8_)[3])();
          }
        }
      }
      piVar10 = (int *)CONCAT44(local_398._12_4_,local_398._8_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if ((Allocator *)local_398._32_8_ == (Allocator *)0x0) {
            free((void *)local_398._0_8_);
          }
          else {
            (*(*(_func_int ***)local_398._32_8_)[3])();
          }
        }
      }
      piVar10 = (int *)CONCAT44(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._4_4_,
                                areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._0_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          free((void *)CONCAT44(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_,
                                areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start._0_4_));
        }
      }
      pFVar15 = faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
          super__Vector_impl_data._M_start !=
          faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        qsort_descent_inplace
                  (&faceproposals,0,
                   (int)(((long)faceproposals.
                                super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)faceproposals.
                               super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                               super__Vector_impl_data._M_start) / 0x3c) + -1);
        pFVar15 = faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      local_398._0_8_ = (pointer)0x0;
      local_398._8_4_ = 0;
      local_398._12_4_ = 0;
      local_398._16_8_ = (pointer)0x0;
      uVar16 = ((long)pFVar15 -
               (long)faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                     _M_impl.super__Vector_impl_data._M_start) / 0x3c;
      iVar13 = (int)uVar16;
      std::vector<float,_std::allocator<float>_>::vector
                (&areas,(long)iVar13,(allocator_type *)local_3e8);
      uVar19 = 0;
      uVar21 = 0;
      if (0 < iVar13) {
        uVar21 = uVar16 & 0xffffffff;
      }
      pfVar17 = &((faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl
                   .super__Vector_impl_data._M_start)->rect).height;
      for (; uVar21 != uVar19; uVar19 = uVar19 + 1) {
        *(float *)(CONCAT44(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_) + uVar19 * 4) =
             pfVar17[-1] * *pfVar17;
        pfVar17 = pfVar17 + 0xf;
      }
      for (local_3e8._0_4_ = 0; (int)local_3e8._0_4_ < iVar13; local_3e8._0_4_ = local_3e8._0_4_ + 1
          ) {
        pFVar15 = faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                  super__Vector_impl_data._M_start + (int)local_3e8._0_4_;
        uVar19 = (ulong)(CONCAT44(local_398._12_4_,local_398._8_4_) - local_398._0_8_) >> 2;
        uVar16 = uVar19 & 0xffffffff;
        if ((int)uVar19 < 1) {
          uVar16 = 0;
        }
        uVar19 = 1;
        for (uVar21 = 0; uVar16 != uVar21; uVar21 = uVar21 + 1) {
          lVar20 = (long)*(int *)(local_398._0_8_ + uVar21 * 4);
          uVar3._0_4_ = (pFVar15->rect).x;
          uVar3._4_4_ = (pFVar15->rect).y;
          auVar30._8_8_ = 0;
          auVar30._0_8_ = uVar3;
          uVar1 = (pFVar15->rect).width;
          uVar6 = (pFVar15->rect).height;
          uVar4._0_4_ = faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar20].rect.x;
          uVar4._4_4_ = faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar20].rect.y;
          auVar29._8_8_ = 0;
          auVar29._0_8_ = uVar4;
          uVar2 = faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar20].rect.width;
          uVar7 = faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar20].rect.height;
          auVar24._0_4_ = (float)uVar2 + (float)(undefined4)uVar4;
          auVar24._4_4_ = (float)uVar7 + (float)uVar4._4_4_;
          auVar24._8_8_ = 0;
          auVar30 = maxps(auVar29,auVar30);
          auVar28._0_4_ = (float)uVar1 + (float)(undefined4)uVar3;
          auVar28._4_4_ = (float)uVar6 + (float)uVar3._4_4_;
          auVar28._8_8_ = 0;
          auVar24 = minps(auVar24,auVar28);
          fVar22 = auVar24._0_4_ - auVar30._0_4_;
          fVar26 = auVar24._4_4_ - auVar30._4_4_;
          fVar23 = 0.0;
          if (0.0 < fVar26 && 0.0 < fVar22) {
            fVar23 = fVar22 * fVar26;
          }
          if (0.4 < fVar23 / ((*(float *)(CONCAT44(areas.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  areas.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._0_4_) +
                                         (long)(int)local_3e8._0_4_ * 4) +
                              *(float *)(CONCAT44(areas.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  areas.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._0_4_) +
                                        lVar20 * 4)) - fVar23)) {
            uVar19 = 0;
          }
        }
        if ((int)uVar19 != 0) {
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)local_398,
                     (value_type_conflict1 *)local_3e8);
        }
      }
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&areas.super__Vector_base<float,_std::allocator<float>_>);
      uVar16 = (ulong)(CONCAT44(local_398._12_4_,local_398._8_4_) - local_398._0_8_) >> 2;
      iVar13 = (int)uVar16;
      std::vector<FaceObject,_std::allocator<FaceObject>_>::resize(&faceobjects,(long)iVar13);
      fVar22 = (float)(int)local_348;
      local_348 = (float)(int)fStack_344 + -1.0;
      fStack_344 = fVar22 + -1.0;
      fStack_340 = (float)(int)fStack_340 + 0.0;
      fStack_33c = (float)(int)fStack_33c + 0.0;
      uVar19 = 0;
      uVar16 = uVar16 & 0xffffffff;
      if (iVar13 < 1) {
        uVar16 = uVar19;
      }
      lVar20 = 8;
      for (; uVar16 != uVar19; uVar19 = uVar19 + 1) {
        FaceObject::operator=
                  ((FaceObject *)
                   ((long)((faceobjects.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                            _M_impl.super__Vector_impl_data._M_start)->landmark + -3) + lVar20),
                   faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl
                   .super__Vector_impl_data._M_start + *(int *)(local_398._0_8_ + uVar19 * 4));
        uVar21 = *(ulong *)((long)((faceobjects.
                                    super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->landmark + -3) +
                           lVar20);
        auVar25._8_8_ = 0;
        auVar25._0_8_ = uVar21;
        uVar5 = *(undefined8 *)
                 ((long)&(((FaceObject *)
                          ((faceobjects.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                            _M_impl.super__Vector_impl_data._M_start)->landmark + -2))->rect).x +
                 lVar20);
        auVar27._0_4_ = (float)uVar5 + (float)uVar21;
        auVar27._4_4_ = (float)((ulong)uVar5 >> 0x20) + (float)(uVar21 >> 0x20);
        auVar27._8_8_ = 0;
        auVar11._4_4_ = fStack_344;
        auVar11._0_4_ = local_348;
        auVar11._8_4_ = fStack_340;
        auVar11._12_4_ = fStack_33c;
        auVar24 = minps(auVar11,auVar25);
        auVar24 = maxps(ZEXT416(0),auVar24);
        auVar30 = minps(auVar11,auVar27);
        auVar30 = maxps(ZEXT816(0),auVar30);
        *(long *)((long)((faceobjects.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                          _M_impl.super__Vector_impl_data._M_start)->landmark + -3) + lVar20) =
             auVar24._0_8_;
        *(ulong *)((long)&(((FaceObject *)
                           ((faceobjects.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>
                             ._M_impl.super__Vector_impl_data._M_start)->landmark + -2))->rect).x +
                  lVar20) = CONCAT44(auVar30._4_4_ - auVar24._4_4_,auVar30._0_4_ - auVar24._0_4_);
        lVar20 = lVar20 + 0x3c;
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)local_398);
      std::_Vector_base<FaceObject,_std::allocator<FaceObject>_>::~_Vector_base
                (&faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>);
      ncnn::Extractor::~Extractor(&ex);
      piVar10 = (int *)CONCAT44(iStack_1ec,local_1f0);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if (local_1d8 == (Allocator *)0x0) {
            free(_image);
          }
          else {
            (*local_1d8->_vptr_Allocator[3])();
          }
        }
      }
      ncnn::Net::~Net(&retinaface);
      cv::Mat::clone();
      lVar20 = 0;
      uVar16 = 0;
      local_348 = 0.0;
      fStack_344 = 0.0;
      fStack_340 = 0.0;
      fStack_33c = 3.7480469;
      while( true ) {
        pFVar15 = faceobjects.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((ulong)(((long)faceobjects.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)faceobjects.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                          _M_impl.super__Vector_impl_data._M_start) / 0x3c) <= uVar16) break;
        local_200 = uVar16;
        fprintf(_stderr,"%.5f at %.2f %.2f %.2f x %.2f\n",
                (double)*(float *)((long)((faceobjects.
                                           super__Vector_base<FaceObject,_std::allocator<FaceObject>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->landmark + 5)
                                  + lVar20),
                (double)*(float *)((long)&(((FaceObject *)
                                           ((faceobjects.
                                             super__Vector_base<FaceObject,_std::allocator<FaceObject>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->landmark +
                                           -2))->rect).x + lVar20),
                (double)*(float *)((long)(faceobjects.
                                          super__Vector_base<FaceObject,_std::allocator<FaceObject>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->landmark +
                                  lVar20 + -0xc),
                (double)*(float *)((long)((faceobjects.
                                           super__Vector_base<FaceObject,_std::allocator<FaceObject>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->landmark + -1
                                         ) + lVar20),
                SUB84((double)*(float *)((long)(faceobjects.
                                                super__Vector_base<FaceObject,_std::allocator<FaceObject>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->landmark
                                        + lVar20 + -4),0),
                ((long)faceobjects.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)faceobjects.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                      _M_impl.super__Vector_impl_data._M_start) % 0x3c);
        areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ = 0x3010000;
        areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)&image;
        pfVar17 = (float *)((long)&(((FaceObject *)(pFVar15->landmark + -2))->rect).x + lVar20);
        local_318._0_4_ = (undefined4)ROUND(*pfVar17);
        local_318._4_4_ = (undefined4)ROUND(pfVar17[1]);
        local_318._8_4_ = (undefined4)ROUND(pfVar17[2]);
        local_318._12_4_ = (undefined4)ROUND(pfVar17[3]);
        cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&retinaface);
        retinaface._vptr_Net = (_func_int **)CONCAT44(fStack_344,local_348);
        retinaface.opt.num_threads = (int)fStack_33c;
        retinaface.opt._0_4_ = fStack_340;
        retinaface.opt.blob_allocator = (Allocator *)0x0;
        retinaface.opt.workspace_allocator = (Allocator *)0x0;
        cv::rectangle(&areas,local_318,&retinaface,1,8,0);
        areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ = 0x3010000;
        areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)&image;
        local_258.data._0_4_ = (int)ROUND(*(float *)((long)&pFVar15->landmark[0].x + lVar20));
        local_258.data._4_4_ = (int)ROUND(*(float *)((long)&pFVar15->landmark[0].y + lVar20));
        cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&retinaface);
        retinaface._vptr_Net = (_func_int **)CONCAT44(fStack_344,local_348);
        retinaface.opt.num_threads = (int)fStack_33c;
        retinaface.opt._0_4_ = fStack_340;
        retinaface.opt.blob_allocator = (Allocator *)0x406fe00000000000;
        retinaface.opt.workspace_allocator = (Allocator *)0x0;
        cv::circle(&areas,&local_258,2,&retinaface,0xffffffff,8,0);
        areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ = 0x3010000;
        areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)&image;
        faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
        super__Vector_impl_data._M_start._4_4_ =
             (int)ROUND(*(float *)((long)&pFVar15->landmark[1].y + lVar20));
        faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ =
             (int)ROUND(*(float *)((long)&pFVar15->landmark[1].x + lVar20));
        cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&retinaface);
        retinaface._vptr_Net = (_func_int **)CONCAT44(fStack_344,local_348);
        retinaface.opt.num_threads = (int)fStack_33c;
        retinaface.opt._0_4_ = fStack_340;
        retinaface.opt.blob_allocator = (Allocator *)0x406fe00000000000;
        retinaface.opt.workspace_allocator = (Allocator *)0x0;
        cv::circle(&areas,&faceproposals,2,&retinaface,0xffffffff,8,0);
        areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ = 0x3010000;
        areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)&image;
        faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
        super__Vector_impl_data._M_start._4_4_ =
             (int)ROUND(*(float *)((long)&pFVar15->landmark[2].y + lVar20));
        faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ =
             (int)ROUND(*(float *)((long)&pFVar15->landmark[2].x + lVar20));
        cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&retinaface);
        retinaface._vptr_Net = (_func_int **)CONCAT44(fStack_344,local_348);
        retinaface.opt.num_threads = (int)fStack_33c;
        retinaface.opt._0_4_ = fStack_340;
        retinaface.opt.blob_allocator = (Allocator *)0x406fe00000000000;
        retinaface.opt.workspace_allocator = (Allocator *)0x0;
        cv::circle(&areas,&faceobjects32,2,&retinaface,0xffffffff,8,0);
        areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ = 0x3010000;
        areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)&image;
        ex._vptr_Extractor._0_4_ = (int)ROUND(*(float *)((long)&pFVar15->landmark[3].x + lVar20));
        ex._vptr_Extractor._4_4_ = (int)ROUND(*(float *)((long)&pFVar15->landmark[3].y + lVar20));
        cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&retinaface);
        retinaface._vptr_Net = (_func_int **)CONCAT44(fStack_344,local_348);
        retinaface.opt.num_threads = (int)fStack_33c;
        retinaface.opt._0_4_ = fStack_340;
        retinaface.opt.blob_allocator = (Allocator *)0x406fe00000000000;
        retinaface.opt.workspace_allocator = (Allocator *)0x0;
        cv::circle(&areas,&ex,2,&retinaface,0xffffffff,8,0);
        areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ = 0x3010000;
        areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)&image;
        local_208 = (int)ROUND(*(float *)((long)&pFVar15->landmark[4].x + lVar20));
        local_204 = (int)ROUND(*(float *)((long)&pFVar15->landmark[4].y + lVar20));
        cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&retinaface);
        retinaface._vptr_Net = (_func_int **)CONCAT44(fStack_344,local_348);
        retinaface.opt.num_threads = (int)fStack_33c;
        retinaface.opt._0_4_ = fStack_340;
        retinaface.opt.blob_allocator = (Allocator *)0x406fe00000000000;
        retinaface.opt.workspace_allocator = (Allocator *)0x0;
        cv::circle(&areas,&local_208,2,&retinaface,0xffffffff,8,0);
        sprintf((char *)&retinaface,"%.1f%%",
                (double)(*(float *)((long)(pFVar15->landmark + 5) + lVar20) * 100.0));
        std::__cxx11::string::string((string *)&areas,(char *)&retinaface,(allocator *)local_3e8);
        cv::getTextSize((string *)&label_size,(int)&areas,0.5,0,(int *)0x1);
        std::__cxx11::string::~string((string *)&areas);
        iVar14 = (int)*(float *)((long)&(((FaceObject *)(pFVar15->landmark + -2))->rect).x + lVar20)
        ;
        iVar13 = (int)((*(float *)((long)pFVar15->landmark + lVar20 + -0xc) -
                       (float)label_size.height) - 0.0);
        if (iVar13 < 1) {
          iVar13 = 0;
        }
        iVar9 = iStack_1ec - label_size.width;
        if (label_size.width + iVar14 <= iStack_1ec) {
          iVar9 = iVar14;
        }
        local_3e8._16_8_ = 0;
        local_3e8._0_4_ = 0x3010000;
        local_2c8._12_4_ = label_size.height;
        local_2c8._8_4_ = label_size.width;
        local_2c8._0_4_ = iVar9;
        local_2c8._4_4_ = iVar13;
        local_3e8._8_8_ = &image;
        cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&areas);
        areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ = 0;
        areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start._4_4_ = 0x406fe000;
        areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish._0_4_ = 0;
        areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish._4_4_ = 0x406fe000;
        areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x406fe00000000000;
        cv::rectangle(local_3e8,local_2c8,(string *)&areas,0xffffffffffffffff,8,0);
        local_3e8._16_8_ = 0;
        local_3e8._0_4_ = 0x3010000;
        local_3e8._8_8_ = &image;
        std::__cxx11::string::string((string *)&areas,(char *)&retinaface,&local_459);
        local_20c = iVar13 + label_size.height;
        local_210 = iVar9;
        cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)local_398);
        local_398._16_8_ = (pointer)0x0;
        local_398._24_4_ = 0;
        local_398._28_4_ = 0;
        local_398._0_8_ = (pointer)0x0;
        local_398._8_4_ = 0;
        local_398._12_4_ = 0;
        cv::putText(0x3fe0000000000000,local_3e8,&areas,&local_210,0,(Matx<double,_4,_1> *)local_398
                    ,1,8,0);
        std::__cxx11::string::~string((string *)&areas);
        uVar16 = local_200 + 1;
        lVar20 = lVar20 + 0x3c;
      }
      std::__cxx11::string::string((string *)&retinaface,"image",(allocator *)local_3e8);
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start._0_4_ = 0x1010000;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)&image;
      cv::imshow((string *)&retinaface,(_InputArray *)&areas);
      std::__cxx11::string::~string((string *)&retinaface);
      iVar13 = 0;
      cv::waitKey(0);
      cv::Mat::~Mat(&image);
      std::_Vector_base<FaceObject,_std::allocator<FaceObject>_>::~_Vector_base
                (&faceobjects.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>);
    }
    else {
      fprintf(_stderr,"cv::imread %s failed\n",pcVar8);
      iVar13 = -1;
    }
    cv::Mat::~Mat(&m);
  }
  else {
    fprintf(_stderr,"Usage: %s [imagepath]\n",*argv);
    iVar13 = -1;
  }
  return iVar13;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 2)
    {
        fprintf(stderr, "Usage: %s [imagepath]\n", argv[0]);
        return -1;
    }

    const char* imagepath = argv[1];

    cv::Mat m = cv::imread(imagepath, 1);
    if (m.empty())
    {
        fprintf(stderr, "cv::imread %s failed\n", imagepath);
        return -1;
    }

    std::vector<FaceObject> faceobjects;
    detect_retinaface(m, faceobjects);

    draw_faceobjects(m, faceobjects);

    return 0;
}